

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O1

void __thiscall
imrt::ACO::ACO(ACO *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  pointer *pppAVar1;
  iterator __position;
  Ant *pAVar2;
  int iVar3;
  double dVar4;
  Ant *aux;
  vector<imrt::Ant*,std::allocator<imrt::Ant*>> *local_f8;
  double local_f0;
  vector<double,_std::allocator<double>_> *local_e8;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  this->_vptr_ACO = (_func_int **)&PTR__ACO_0013cb88;
  this->n_ants = _n_ants;
  this->initial_pheromone = _initial_pheromone;
  local_c8 = &this->pheromone;
  local_f8 = (vector<imrt::Ant*,std::allocator<imrt::Ant*>> *)_alpha;
  local_f0 = _rho;
  local_e8 = (vector<double,_std::allocator<double>_> *)_beta;
  local_e0 = volumes;
  local_d8 = Zmax;
  local_d0 = Zmin;
  memset(local_c8,0,0x90);
  this->alpha = (double)local_f8;
  this->beta = (double)local_e8;
  this->rho = local_f0;
  local_f8 = (vector<imrt::Ant*,std::allocator<imrt::Ant*>> *)&this->ants;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = _collimator;
  this->max_apertures = _max_apertures;
  this->max_no_improvement = 100.0;
  initializePheromone(this);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,w);
  local_e8 = w;
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,local_d0);
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,local_d8);
  initializeHeuristic(this,&local_90,&local_a8,&local_c0,local_e0,max_intensity,initial_intensity,
                      step_intensity);
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < this->n_ants) {
    local_f0 = 1.79769313486232e+308;
    iVar3 = 0;
    do {
      pAVar2 = (Ant *)operator_new(0x50);
      std::vector<double,_std::allocator<double>_>::vector(&local_48,local_e8);
      std::vector<double,_std::allocator<double>_>::vector(&local_60,local_d0);
      std::vector<double,_std::allocator<double>_>::vector(&local_78,local_d8);
      Ant::Ant(pAVar2,&local_48,&local_60,&local_78,this->collimator,local_e0,this->max_apertures,
               max_intensity,initial_intensity,step_intensity);
      aux = pAVar2;
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __position._M_current =
           (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<imrt::Ant*,std::allocator<imrt::Ant*>>::_M_realloc_insert<imrt::Ant*const&>
                  (local_f8,__position,&aux);
      }
      else {
        *__position._M_current = aux;
        pppAVar1 = &(this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
      dVar4 = Ant::getEvaluation(aux);
      if (dVar4 < local_f0) {
        local_f0 = Ant::getEvaluation(aux);
        this->iteration_best = aux;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->n_ants);
  }
  evaporation(this);
  globalDeposit(this,this->iteration_best);
  pAVar2 = (Ant *)operator_new(0x50);
  Ant::Ant(pAVar2,this->iteration_best);
  this->global_best = pAVar2;
  return;
}

Assistant:

ACO (vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
       vector<Volume>& volumes, int _max_apertures, int max_intensity, int initial_intensity,
       int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, 
       double _rho): collimator(_collimator), max_apertures(_max_apertures), n_ants(_n_ants), 
        initial_pheromone(_initial_pheromone), alpha(_alpha), beta(_beta), rho(_rho) {
  
    Ant * aux;
    double initial_best = DBL_MAX;
    
    initializePheromone();
    initializeHeuristic(w,Zmin, Zmax, volumes, max_intensity, initial_intensity, step_intensity);
    
    for (int i=0; i < n_ants; i++) {
      aux = new Ant(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity);
      ants.push_back(aux);
      if (initial_best > aux->getEvaluation()) {
        initial_best = aux->getEvaluation();
        iteration_best = aux;
      }
    }
    evaporation();
    globalDeposit (iteration_best);
    global_best =new Ant (*iteration_best);
    
    
  }